

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

MicroRep * __thiscall
google::protobuf::internal::MicroString::AllocateMicroRep
          (MicroString *this,size_t size,Arena *arena)

{
  MicroRep *pMVar1;
  ulong uVar2;
  SizedPtr SVar3;
  LogMessageFatal LStack_28;
  
  uVar2 = size + 9 & 0xfffffffffffffff8;
  if (arena == (Arena *)0x0) {
    SVar3 = AllocateAtLeast(uVar2);
    pMVar1 = (MicroRep *)SVar3.p;
    uVar2 = SVar3.n - 2;
    if (0xfe < uVar2) {
      uVar2 = 0xff;
    }
  }
  else {
    uVar2 = uVar2 - 2;
    if (0xfe < uVar2) {
      uVar2 = 0xff;
    }
    pMVar1 = (MicroRep *)Arena::AllocateAligned(arena,uVar2 + 2,8);
  }
  pMVar1->capacity = (uint8_t)uVar2;
  pMVar1->size = (uint8_t)size;
  this->rep_ = pMVar1 + 1;
  if (((ulong)pMVar1 & 2) == 0) {
    return pMVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
             ,0x74,"is_micro_rep()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

MicroString::MicroRep* MicroString::AllocateMicroRep(size_t size,
                                                     Arena* arena) {
  MicroRep* h;
  size_t capacity = size;
  if (arena == nullptr) {
    const internal::SizedPtr alloc = internal::AllocateAtLeast(
        ArenaAlignDefault::Ceil(MicroRepSize(capacity)));
    // Maybe we rounded up too much.
    capacity = std::min(kMaxMicroRepCapacity, alloc.n - sizeof(MicroRep));
    h = reinterpret_cast<MicroRep*>(alloc.p);
  } else {
    capacity =
        ArenaAlignDefault::Ceil(capacity + sizeof(MicroRep)) - sizeof(MicroRep);
    capacity = std::min(kMaxMicroRepCapacity, capacity);
    auto* alloc = arena->AllocateAligned(MicroRepSize(capacity));
    h = reinterpret_cast<MicroRep*>(alloc);
  }
  h->capacity = capacity;
  h->SetInitialSize(size);

  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) + kIsMicroRepTag);
  ABSL_DCHECK(is_micro_rep());

  return h;
}